

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPExternalTransmitter::InjectRTP
          (RTPExternalTransmitter *this,void *data,size_t len,RTPAddress *a)

{
  uint8_t *buf;
  RTPTime data_00;
  int iVar1;
  RTPMemoryManager *pRVar2;
  undefined4 extraout_var;
  RTPRawPacket *this_00;
  RTPRawPacket *local_48;
  RTPRawPacket *pack;
  RTPTime curtime;
  uint8_t *datacopy;
  RTPAddress *addr;
  RTPAddress *a_local;
  size_t len_local;
  void *data_local;
  RTPExternalTransmitter *this_local;
  RTPAddress *address;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    iVar1 = (**a->_vptr_RTPAddress)(a,pRVar2);
    address = (RTPAddress *)CONCAT44(extraout_var,iVar1);
    if (address != (RTPAddress *)0x0) {
      pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      curtime.m_t = (double)operator_new__(len,pRVar2,1);
      if ((void *)curtime.m_t == (void *)0x0) {
        pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPDelete<jrtplib::RTPAddress>(address,pRVar2);
      }
      else {
        memcpy((void *)curtime.m_t,data,len);
        pack = (RTPRawPacket *)RTPTime::CurrentTime();
        pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        this_00 = (RTPRawPacket *)operator_new(0x38,pRVar2,0x1b);
        data_00 = curtime;
        pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPRawPacket::RTPRawPacket
                  (this_00,(uint8_t *)data_00.m_t,len,address,(RTPTime *)&pack,true,pRVar2);
        local_48 = this_00;
        if (this_00 == (RTPRawPacket *)0x0) {
          pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDelete<jrtplib::RTPAddress>(address,pRVar2);
          buf = this->localhostname;
          pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray(buf,pRVar2);
        }
        else {
          std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
          push_back(&this->rawpacketlist,&local_48);
          if (this->m_abortCount == 0) {
            RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
            this->m_abortCount = this->m_abortCount + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RTPExternalTransmitter::InjectRTP(const void *data, size_t len, const RTPAddress &a)
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return;
	}

	RTPAddress *addr = a.CreateCopy(GetMemoryManager());
	if (addr == 0)
		return;

	uint8_t *datacopy;

	datacopy = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET) uint8_t[len];
	if (datacopy == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		return;
	}
	memcpy(datacopy, data, len);

	RTPTime curtime = RTPTime::CurrentTime();
	RTPRawPacket *pack;

	pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,len,addr,curtime,true,GetMemoryManager());
	if (pack == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		return;
	}
	rawpacketlist.push_back(pack);

	if (m_abortCount == 0)
	{
		m_abortDesc.SendAbortSignal();
		m_abortCount++;
	}

	MAINMUTEX_UNLOCK
}